

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O0

int __thiscall
FNodeBuilder::OutputDegenerateSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,bool bForward,double lastdot,FPrivSeg **prev,vertex_t *outVerts)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DWORD DVar7;
  subsector_t *psVar8;
  USegPtr *pUVar9;
  FPrivVert *pFVar10;
  double dVar11;
  double dVar12;
  FPrivSeg *pFVar13;
  FPrivSeg *local_a8;
  FPrivSeg *bestseg;
  double bestdot;
  bool wantside;
  double dy2;
  double dx2;
  double dy;
  double dx;
  double y1;
  double x1;
  double dot;
  int count;
  int max;
  int first;
  int j;
  int i;
  FPrivSeg *seg;
  vertex_t *outVerts_local;
  FPrivSeg **prev_local;
  double lastdot_local;
  bool bForward_local;
  int subsector_local;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs_local;
  FNodeBuilder *this_local;
  
  psVar8 = TArray<subsector_t,_subsector_t>::operator[](&this->Subsectors,(long)subsector);
  iVar5 = (int)psVar8->firstline;
  psVar8 = TArray<subsector_t,_subsector_t>::operator[](&this->Subsectors,(long)subsector);
  iVar6 = iVar5 + psVar8->numlines;
  dot._4_4_ = 0;
  pUVar9 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                     (&this->SegList,(long)iVar5);
  _j = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                 (&this->Segs,(ulong)pUVar9->SegNum);
  pFVar10 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                      (&this->Vertices,(long)_j->v1);
  dVar11 = (double)(pFVar10->super_FSimpleVert).x;
  pFVar10 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                      (&this->Vertices,(long)_j->v1);
  dVar12 = (double)(pFVar10->super_FSimpleVert).y;
  pFVar10 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                      (&this->Vertices,(long)_j->v2);
  iVar2 = (pFVar10->super_FSimpleVert).x;
  pFVar10 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                      (&this->Vertices,(long)_j->v2);
  iVar3 = (pFVar10->super_FSimpleVert).y;
  bVar1 = _j->planefront;
  prev_local = (FPrivSeg **)lastdot;
  first = iVar5;
  while (first = first + 1, first < iVar6) {
    local_a8 = (FPrivSeg *)0x0;
    bestseg = (FPrivSeg *)OutputDegenerateSubsector::bestinit[bForward];
    max = iVar5;
    while (max = max + 1, max < iVar6) {
      pUVar9 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                         (&this->SegList,(long)max);
      _j = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)pUVar9->SegNum);
      if ((bool)(_j->planefront & 1U) == ((bVar1 & 1U) != ((bForward ^ 0xffU) & 1))) {
        pFVar10 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                            (&this->Vertices,(long)_j->v1);
        iVar4 = (pFVar10->super_FSimpleVert).x;
        pFVar10 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                            (&this->Vertices,(long)_j->v1);
        pFVar13 = (FPrivSeg *)
                  (((double)iVar2 - dVar11) * ((double)iVar4 - dVar11) +
                  ((double)iVar3 - dVar12) * ((double)(pFVar10->super_FSimpleVert).y - dVar12));
        if (bForward) {
          if (((double)pFVar13 < (double)bestseg) && ((double)prev_local < (double)pFVar13)) {
            local_a8 = _j;
            bestseg = pFVar13;
          }
        }
        else if (((double)bestseg < (double)pFVar13) && ((double)pFVar13 < (double)prev_local)) {
          local_a8 = _j;
          bestseg = pFVar13;
        }
      }
    }
    if (local_a8 != (FPrivSeg *)0x0) {
      if ((*prev)->v2 != local_a8->v1) {
        PushConnectingGLSeg(this,subsector,segs,outVerts + (*prev)->v2,outVerts + local_a8->v1);
        dot._4_4_ = dot._4_4_ + 1;
      }
      DVar7 = PushGLSeg(this,segs,local_a8,outVerts);
      _j->storedseg = DVar7;
      dot._4_4_ = dot._4_4_ + 1;
      *prev = local_a8;
      prev_local = (FPrivSeg **)bestseg;
    }
  }
  return dot._4_4_;
}

Assistant:

int FNodeBuilder::OutputDegenerateSubsector (TArray<glseg_t> &segs, int subsector, bool bForward, double lastdot, FPrivSeg *&prev, vertex_t *outVerts)
{
	static const double bestinit[2] = { -DBL_MAX, DBL_MAX };
	FPrivSeg *seg;
	int i, j, first, max, count;
	double dot, x1, y1, dx, dy, dx2, dy2;
	bool wantside;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	seg = &Segs[SegList[first].SegNum];
	x1 = Vertices[seg->v1].x;
	y1 = Vertices[seg->v1].y;
	dx = Vertices[seg->v2].x - x1;
	dy = Vertices[seg->v2].y - y1;
	wantside = seg->planefront ^ !bForward;

	for (i = first + 1; i < max; ++i)
	{
		double bestdot = bestinit[bForward];
		FPrivSeg *bestseg = NULL;
		for (j = first + 1; j < max; ++j)
		{
			seg = &Segs[SegList[j].SegNum];
			if (seg->planefront != wantside)
			{
				continue;
			}
			dx2 = Vertices[seg->v1].x - x1;
			dy2 = Vertices[seg->v1].y - y1;
			dot = dx*dx2 + dy*dy2;

			if (bForward)
			{
				if (dot < bestdot && dot > lastdot)
				{
					bestdot = dot;
					bestseg = seg;
				}
			}
			else
			{
				if (dot > bestdot && dot < lastdot)
				{
					bestdot = dot;
					bestseg = seg;
				}
			}
		}
		if (bestseg != NULL)
		{
			if (prev->v2 != bestseg->v1)
			{
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[bestseg->v1]);
				count++;
			}
			seg->storedseg = PushGLSeg (segs, bestseg, outVerts);
			count++;
			prev = bestseg;
			lastdot = bestdot;
		}
	}
	return count;
}